

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall slang::parsing::Parser::parseClockingItem(Parser *this)

{
  Token semi_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token keyword;
  Token output_00;
  Token input_00;
  Info *pIVar1;
  Info *pIVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  MemberSyntax *pMVar6;
  size_type sVar7;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  Token TVar8;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> local_2b0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_280;
  anon_class_8_1_8991fb9c local_240;
  undefined4 local_234;
  undefined1 local_230 [8];
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> decls;
  Token semi;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_188;
  ClockingSkewSyntax *local_158;
  Token local_150;
  Token local_140;
  ClockingDirectionSyntax *direction;
  SourceLocation local_120;
  SourceLocation local_118;
  DiagCode local_10c;
  string_view local_108;
  SourceLocation local_f8;
  SourceLocation local_f0;
  DiagCode local_e4;
  Token local_e0;
  string_view local_d0;
  SourceLocation local_c0;
  SourceLocation local_b8;
  DiagCode local_ac;
  Token local_a8;
  SourceLocation local_98;
  DiagCode local_8c;
  Token local_88;
  ClockingSkewSyntax *local_78;
  ClockingSkewSyntax *outputSkew;
  ClockingSkewSyntax *inputSkew;
  Token output;
  Token input;
  Info *local_40;
  TokenKind local_38;
  Info *local_28;
  Token def;
  Parser *this_local;
  
  def.info = (Info *)this;
  Token::Token((Token *)&local_28);
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  local_38 = TVar8.kind;
  if (local_38 == DefaultKeyword) {
    TVar8 = ParserBase::consume(&this->super_ParserBase);
    input.info = TVar8._0_8_;
    local_28 = input.info;
    local_40 = TVar8.info;
    def._0_8_ = local_40;
  }
  else if ((1 < (ushort)(local_38 - InOutKeyword)) && (local_38 != OutputKeyword)) {
    pMVar6 = parseSingleMember(this,ClockingItem);
    return pMVar6;
  }
  Token::Token((Token *)&output.info);
  Token::Token((Token *)&inputSkew);
  outputSkew = (ClockingSkewSyntax *)0x0;
  local_78 = (ClockingSkewSyntax *)0x0;
  bVar4 = ParserBase::peek(&this->super_ParserBase,InOutKeyword);
  if (bVar4) {
    local_88 = ParserBase::consume(&this->super_ParserBase);
    output.info = (Info *)local_88._0_8_;
    input._0_8_ = local_88.info;
    bVar4 = Token::operator_cast_to_bool((Token *)&local_28);
    if (bVar4) {
      local_8c.subsystem = Parser;
      local_8c.code = 0x4d;
      local_98 = Token::location((Token *)&output.info);
      ParserBase::addDiag(&this->super_ParserBase,local_8c,local_98);
    }
  }
  else {
    bVar4 = ParserBase::peek(&this->super_ParserBase,InputKeyword);
    if (bVar4) {
      local_a8 = ParserBase::consume(&this->super_ParserBase);
      output.info = (Info *)local_a8._0_8_;
      input._0_8_ = local_a8.info;
      outputSkew = parseClockingSkew(this);
      bVar4 = Token::operator_cast_to_bool((Token *)&local_28);
      if ((bVar4) && (outputSkew == (ClockingSkewSyntax *)0x0)) {
        local_ac.subsystem = Parser;
        local_ac.code = 0x23;
        local_c0 = Token::location((Token *)&output.info);
        local_d0 = Token::rawText((Token *)&output.info);
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_d0);
        local_b8 = SourceLocation::operator+(&local_c0,sVar7);
        ParserBase::addDiag(&this->super_ParserBase,local_ac,local_b8);
      }
    }
    bVar4 = ParserBase::peek(&this->super_ParserBase,OutputKeyword);
    if (bVar4) {
      local_e0 = ParserBase::consume(&this->super_ParserBase);
      inputSkew = (ClockingSkewSyntax *)local_e0._0_8_;
      output._0_8_ = local_e0.info;
      local_78 = parseClockingSkew(this);
      bVar4 = Token::operator_cast_to_bool((Token *)&local_28);
      if ((bVar4) && (local_78 == (ClockingSkewSyntax *)0x0)) {
        local_e4.subsystem = Parser;
        local_e4.code = 0x23;
        local_f8 = Token::location((Token *)&inputSkew);
        local_108 = Token::rawText((Token *)&inputSkew);
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_108);
        local_f0 = SourceLocation::operator+(&local_f8,sVar7);
        ParserBase::addDiag(&this->super_ParserBase,local_e4,local_f0);
      }
    }
    bVar4 = Token::operator_cast_to_bool((Token *)&local_28);
    if (((bVar4) && (bVar4 = Token::operator_cast_to_bool((Token *)&output.info), !bVar4)) &&
       (bVar4 = Token::operator_cast_to_bool((Token *)&inputSkew), !bVar4)) {
      local_10c.subsystem = Parser;
      local_10c.code = 0x23;
      local_120 = Token::location((Token *)&local_28);
      _direction = Token::valueText((Token *)&local_28);
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&direction);
      local_118 = SourceLocation::operator+(&local_120,sVar7);
      ParserBase::addDiag(&this->super_ParserBase,local_10c,local_118);
    }
  }
  local_150.info = output.info;
  local_140.kind = input.kind;
  local_140._2_1_ = input._2_1_;
  local_140.numFlags.raw = input.numFlags.raw;
  local_140.rawLen = input.rawLen;
  local_158 = inputSkew;
  local_150.kind = output.kind;
  local_150._2_1_ = output._2_1_;
  local_150.numFlags.raw = output.numFlags.raw;
  local_150.rawLen = output.rawLen;
  input_00.info = (Info *)input._0_8_;
  input_00._0_8_ = output.info;
  output_00.info = (Info *)output._0_8_;
  output_00._0_8_ = inputSkew;
  local_140.info =
       (Info *)slang::syntax::SyntaxFactory::clockingDirection
                         (&this->factory,input_00,outputSkew,output_00,local_78);
  bVar4 = Token::operator_cast_to_bool((Token *)&local_28);
  if (bVar4) {
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (&local_188,(nullptr_t)0x0);
    uVar3 = def._0_8_;
    pIVar2 = local_28;
    pIVar1 = local_140.info;
    TVar8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    keyword.info = (Info *)uVar3;
    keyword._0_8_ = pIVar2;
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::defaultSkewItem
                           (&this->factory,&local_188,keyword,(ClockingDirectionSyntax *)pIVar1,
                            TVar8);
  }
  else {
    Token::Token((Token *)(decls.stackBase + 0x40));
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)local_230);
    local_234 = 0x310005;
    local_240.this = this;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon,slang::parsing::Parser::parseClockingItem()::__0>
              (&this->super_ParserBase,(SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_230,
               Semicolon,Comma,(Token *)(decls.stackBase + 0x40),True,(DiagCode)0x310005,&local_240,
               False);
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (&local_280,(nullptr_t)0x0);
    pIVar1 = local_140.info;
    iVar5 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_230,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
    elements.data_._4_4_ = extraout_var;
    elements.data_._0_4_ = iVar5;
    elements.size_ = extraout_RDX;
    slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::SeparatedSyntaxList
              (&local_2b0,elements);
    semi_00.info = (Info *)semi._0_8_;
    semi_00._0_8_ = decls.stackBase._64_8_;
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::clockingItem
                           (&this->factory,&local_280,(ClockingDirectionSyntax *)pIVar1,&local_2b0,
                            semi_00);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)local_230);
  }
  return (MemberSyntax *)this_local;
}

Assistant:

MemberSyntax* Parser::parseClockingItem() {
    Token def;
    switch (peek().kind) {
        case TokenKind::DefaultKeyword:
            def = consume();
            break;
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
            break;
        default:
            return parseSingleMember(SyntaxKind::ClockingItem);
    }

    Token input, output;
    ClockingSkewSyntax* inputSkew = nullptr;
    ClockingSkewSyntax* outputSkew = nullptr;
    if (peek(TokenKind::InOutKeyword)) {
        input = consume();
        if (def)
            addDiag(diag::InOutDefaultSkew, input.location());
    }
    else {
        if (peek(TokenKind::InputKeyword)) {
            input = consume();
            inputSkew = parseClockingSkew();
            if (def && !inputSkew)
                addDiag(diag::ExpectedClockingSkew, input.location() + input.rawText().length());
        }

        if (peek(TokenKind::OutputKeyword)) {
            output = consume();
            outputSkew = parseClockingSkew();
            if (def && !outputSkew)
                addDiag(diag::ExpectedClockingSkew, output.location() + output.rawText().length());
        }

        if (def && !input && !output)
            addDiag(diag::ExpectedClockingSkew, def.location() + def.valueText().length());
    }

    auto& direction = factory.clockingDirection(input, inputSkew, output, outputSkew);
    if (def)
        return &factory.defaultSkewItem(nullptr, def, direction, expect(TokenKind::Semicolon));

    Token semi;
    SmallVector<TokenOrSyntax, 4> decls;
    parseList<isIdentifierOrComma, isSemicolon>(decls, TokenKind::Semicolon, TokenKind::Comma, semi,
                                                RequireItems::True, diag::ExpectedIdentifier,
                                                [this] { return &parseAttributeSpec(); });

    return &factory.clockingItem(nullptr, direction, decls.copy(alloc), semi);
}